

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O2

void Abc_NtkShow(Abc_Ntk_t *pNtk0,int fGateNames,int fSeq,int fUseReverse)

{
  int iVar1;
  FILE *__stream;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  void *Entry;
  char FileNameDot [200];
  
  if (pNtk0->ntkType != ABC_NTK_LOGIC) {
    if (pNtk0->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk0) || Abc_NtkIsLogic(pNtk0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcShow.c"
                    ,0xca,"void Abc_NtkShow(Abc_Ntk_t *, int, int, int)");
    }
    iVar1 = Abc_NtkGetChoiceNum(pNtk0);
    if (iVar1 != 0) {
      puts("Temporarily visualization of AIGs with choice nodes is disabled.");
      return;
    }
  }
  Abc_ShowGetFileName(pNtk0->pName,FileNameDot);
  __stream = fopen(FileNameDot,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",FileNameDot);
  }
  else {
    fclose(__stream);
    pNtk = Abc_NtkDup(pNtk0);
    if ((pNtk->ntkType == ABC_NTK_LOGIC) && (pNtk->ntkFunc != ABC_FUNC_MAP)) {
      Abc_NtkToSop(pNtk,-1,1000000000);
    }
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar2 = (void **)malloc(800);
    vNodes->pArray = ppvVar2;
    for (iVar1 = 0; iVar1 < pNtk->vObjs->nSize; iVar1 = iVar1 + 1) {
      Entry = Vec_PtrEntry(pNtk->vObjs,iVar1);
      if (Entry != (void *)0x0) {
        Vec_PtrPush(vNodes,Entry);
      }
    }
    iVar1 = pNtk->nBarBufs;
    pNtk->nBarBufs = 0;
    if (fSeq == 0) {
      Io_WriteDotNtk(pNtk,vNodes,(Vec_Ptr_t *)0x0,FileNameDot,fGateNames,fUseReverse);
    }
    else {
      Io_WriteDotSeq(pNtk,vNodes,(Vec_Ptr_t *)0x0,FileNameDot,fGateNames,fUseReverse);
    }
    pNtk->nBarBufs = iVar1;
    Vec_PtrFree(vNodes);
    Abc_ShowFile(FileNameDot);
    Abc_NtkDelete(pNtk);
  }
  return;
}

Assistant:

void Abc_NtkShow( Abc_Ntk_t * pNtk0, int fGateNames, int fSeq, int fUseReverse )
{
    FILE * pFile;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pNode;
    Vec_Ptr_t * vNodes;
    int nBarBufs;
    char FileNameDot[200];
    int i;

    assert( Abc_NtkIsStrash(pNtk0) || Abc_NtkIsLogic(pNtk0) );
    if ( Abc_NtkIsStrash(pNtk0) && Abc_NtkGetChoiceNum(pNtk0) )
    {
        printf( "Temporarily visualization of AIGs with choice nodes is disabled.\n" );
        return;
    }
    // create the file name
    Abc_ShowGetFileName( pNtk0->pName, FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );


    // convert to logic SOP
    pNtk = Abc_NtkDup( pNtk0 );
    if ( Abc_NtkIsLogic(pNtk) && !Abc_NtkHasMapping(pNtk) )
        Abc_NtkToSop( pNtk, -1, ABC_INFINITY );

    // collect all nodes in the network
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachObj( pNtk, pNode, i )
        Vec_PtrPush( vNodes, pNode );
    // write the DOT file
    nBarBufs = pNtk->nBarBufs;
    pNtk->nBarBufs = 0;
    if ( fSeq )
        Io_WriteDotSeq( pNtk, vNodes, NULL, FileNameDot, fGateNames, fUseReverse );
    else
        Io_WriteDotNtk( pNtk, vNodes, NULL, FileNameDot, fGateNames, fUseReverse );
    pNtk->nBarBufs = nBarBufs;
    Vec_PtrFree( vNodes );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
    Abc_NtkDelete( pNtk );
}